

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::ParseResultType>::BasicResult
          (BasicResult<Catch::Clara::ParseResultType> *this,
          BasicResult<Catch::Clara::ParseResultType> *param_1)

{
  ResultType RVar1;
  
  RVar1 = (param_1->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.m_type;
  (this->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.m_type = RVar1;
  (this->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__ResultValueBase_001a75b8;
  if (RVar1 == Ok) {
    *(undefined4 *)
     &(this->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.field_0xc =
         *(undefined4 *)
          &(param_1->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
           field_0xc;
  }
  (this->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001a7560;
  std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)&param_1->m_errorMessage);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const& other ):
                    ResultValueBase<T>( other.type() ),
                    m_errorMessage( other.errorMessage() ) {
                    assert( type() != ResultType::Ok );
                }